

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O1

void __thiscall CAPSFile::~CAPSFile(CAPSFile *this)

{
  pointer paVar1;
  pointer paVar2;
  pointer paVar3;
  
  this->_vptr_CAPSFile = (_func_int **)&PTR__CAPSFile_00181de0;
  Clear(this);
  paVar1 = (this->list_tracks_).
           super__Vector_base<CAPSFile::Trackchunk,_std::allocator<CAPSFile::Trackchunk>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar1 != (pointer)0x0) {
    operator_delete(paVar1,(long)(this->list_tracks_).
                                 super__Vector_base<CAPSFile::Trackchunk,_std::allocator<CAPSFile::Trackchunk>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar1);
  }
  paVar2 = (this->list_data_).
           super__Vector_base<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar2 != (pointer)0x0) {
    operator_delete(paVar2,(long)(this->list_data_).
                                 super__Vector_base<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar2);
  }
  paVar3 = (this->list_imge_).
           super__Vector_base<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar3 != (pointer)0x0) {
    operator_delete(paVar3,(long)(this->list_imge_).
                                 super__Vector_base<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar3);
    return;
  }
  return;
}

Assistant:

CAPSFile::~CAPSFile()
{
   CAPSFile::Clear();
}